

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrCore.cpp
# Opt level: O2

void __thiscall amrex::AmrCore::regrid(AmrCore *this,int lbase,Real time,bool param_3)

{
  long lVar1;
  bool bVar2;
  undefined7 extraout_var;
  int lev;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  DistributionMapping level_dmap;
  DistributionMapping new_dmap;
  int local_e4;
  Real local_e0;
  uint local_d4;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_d0;
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_98 [104];
  
  if ((this->super_AmrMesh).super_AmrInfo.max_level <= lbase) {
    return;
  }
  local_e0 = time;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_d0,(long)*(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c + 2,
             (allocator_type *)local_98);
  AmrMesh::MakeNewGrids
            (&this->super_AmrMesh,lbase,local_e0,&local_e4,
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_d0);
  uVar3 = (ulong)lbase;
  uVar6 = 0;
  do {
    lVar5 = uVar3 * 0x68;
    lVar1 = uVar3 * 0x10;
    uVar4 = uVar3;
    local_d4 = uVar6;
    while( true ) {
      uVar3 = uVar4 + 1;
      uVar7 = (ulong)local_e4;
      if ((long)uVar7 <= (long)uVar4) {
        while ((int)uVar7 < *(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c) {
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          (*(this->super_AmrMesh)._vptr_AmrMesh[10])(this,uVar7);
          AmrMesh::ClearBoxArray(&this->super_AmrMesh,uVar6);
          AmrMesh::ClearDistributionMap(&this->super_AmrMesh,uVar6);
        }
        *(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c = local_e4;
        std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_d0);
        return;
      }
      lev = (int)uVar3;
      if ((long)uVar4 < (long)*(int *)&(this->super_AmrMesh).super_AmrInfo.field_0x8c) break;
      DistributionMapping::DistributionMapping
                ((DistributionMapping *)local_98,
                 (BoxArray *)
                 ((long)&local_d0.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar5),
                 *(int *)(ParallelContext::frames + 0x10));
      uVar6 = (this->super_AmrMesh).num_setdm;
      (*(this->super_AmrMesh)._vptr_AmrMesh[8])
                (local_e0,this,uVar3 & 0xffffffff,
                 (long)&local_d0.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar5,
                 (BoxArray *)local_98);
      AmrMesh::SetBoxArray
                (&this->super_AmrMesh,lev,
                 (BoxArray *)
                 ((long)&local_d0.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar5));
      if (uVar6 == (this->super_AmrMesh).num_setdm) {
        AmrMesh::SetDistributionMap(&this->super_AmrMesh,lev,(DistributionMapping *)local_98);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      lVar5 = lVar5 + 0x68;
      lVar1 = lVar1 + 0x10;
      uVar4 = uVar3;
    }
    bVar2 = BoxArray::operator!=
                      ((BoxArray *)
                       ((long)&local_d0.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar5
                       ),(BoxArray *)
                         ((long)&(this->super_AmrMesh).grids.
                                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                         lVar5));
    uVar6 = 0;
    if ((local_d4 & 1) != 0 || bVar2) {
      BoxArray::BoxArray((BoxArray *)local_98,
                         (BoxArray *)
                         ((long)&(this->super_AmrMesh).grids.
                                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                         lVar5));
      std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(this->super_AmrMesh).dmap.
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_ref.
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar1));
      if (bVar2) {
        BoxArray::operator=((BoxArray *)local_98,
                            (BoxArray *)
                            ((long)&local_d0.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                            lVar5));
        DistributionMapping::DistributionMapping
                  ((DistributionMapping *)&local_a8,(BoxArray *)local_98,
                   *(int *)(ParallelContext::frames + 0x10));
        std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_b8,&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      }
      uVar6 = (this->super_AmrMesh).num_setdm;
      (*(this->super_AmrMesh)._vptr_AmrMesh[9])
                (local_e0,this,uVar3 & 0xffffffff,(BoxArray *)local_98,&local_b8);
      AmrMesh::SetBoxArray(&this->super_AmrMesh,lev,(BoxArray *)local_98);
      if (uVar6 == (this->super_AmrMesh).num_setdm) {
        AmrMesh::SetDistributionMap(&this->super_AmrMesh,lev,(DistributionMapping *)&local_b8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      BoxArray::~BoxArray((BoxArray *)local_98);
      uVar6 = (uint)CONCAT71(extraout_var,bVar2);
    }
  } while( true );
}

Assistant:

void
AmrCore::regrid (int lbase, Real time, bool)
{
    if (lbase >= max_level) return;

    int new_finest;
    Vector<BoxArray> new_grids(finest_level+2);
    MakeNewGrids(lbase, time, new_finest, new_grids);

    BL_ASSERT(new_finest <= finest_level+1);

    bool coarse_ba_changed = false;
    for (int lev = lbase+1; lev <= new_finest; ++lev)
    {
        if (lev <= finest_level) // an old level
        {
            bool ba_changed = (new_grids[lev] != grids[lev]);
            if (ba_changed || coarse_ba_changed) {
                BoxArray level_grids = grids[lev];
                DistributionMapping level_dmap = dmap[lev];
                if (ba_changed) {
                    level_grids = new_grids[lev];
                    level_dmap = DistributionMapping(level_grids);
                }
                const auto old_num_setdm = num_setdm;
                RemakeLevel(lev, time, level_grids, level_dmap);
                SetBoxArray(lev, level_grids);
                if (old_num_setdm == num_setdm) {
                    SetDistributionMap(lev, level_dmap);
                }
            }
            coarse_ba_changed = ba_changed;;
        }
        else  // a new level
        {
            DistributionMapping new_dmap(new_grids[lev]);
            const auto old_num_setdm = num_setdm;
            MakeNewLevelFromCoarse(lev, time, new_grids[lev], new_dmap);
            SetBoxArray(lev, new_grids[lev]);
            if (old_num_setdm == num_setdm) {
                SetDistributionMap(lev, new_dmap);
            }
        }
    }

    for (int lev = new_finest+1; lev <= finest_level; ++lev) {
        ClearLevel(lev);
        ClearBoxArray(lev);
        ClearDistributionMap(lev);
    }

    finest_level = new_finest;
}